

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

void emit_ARB1_TEXM3X2TEX(Context *ctx)

{
  uint uVar1;
  size_t buflen;
  char *pcVar2;
  char *pcVar3;
  char dst [64];
  char src1 [64];
  char src0 [64];
  char src2 [64];
  char local_138 [64];
  char local_f8 [64];
  char local_b8 [64];
  char local_78 [72];
  
  if (ctx->texm3x2pad_src0 != -1) {
    uVar1 = (ctx->dest_arg).regnum;
    pcVar3 = "t";
    pcVar2 = "t";
    if (ctx->shader_type == MOJOSHADER_TYPE_VERTEX) {
      pcVar2 = "a";
    }
    snprintf(local_138,0x10,"%u");
    snprintf(local_b8,0x40,"%s%s",pcVar2,local_138);
    pcVar2 = "t";
    if (ctx->shader_type == MOJOSHADER_TYPE_VERTEX) {
      pcVar2 = "a";
    }
    snprintf(local_138,0x10,"%u",(ulong)(uint)ctx->texm3x2pad_dst0);
    snprintf(local_f8,0x40,"%s%s",pcVar2,local_138);
    if (ctx->shader_type == MOJOSHADER_TYPE_VERTEX) {
      pcVar3 = "a";
    }
    snprintf(local_138,0x10,"%u",(ulong)(uint)ctx->source_args[0].regnum);
    snprintf(local_78,0x40,"%s%s",pcVar3,local_138);
    get_ARB1_destarg_varname(ctx,local_138,buflen);
    output_line(ctx,"DP3 %s.y, %s, %s;",local_138,local_78,local_138);
    output_line(ctx,"DP3 %s.x, %s, %s;",local_138,local_b8,local_f8);
    output_line(ctx,"TEX %s, %s, texture[%d], 2D;",local_138,local_138,(ulong)uVar1);
    emit_ARB1_dest_modifiers(ctx);
  }
  return;
}

Assistant:

static void emit_ARB1_TEXM3X2TEX(Context *ctx)
{
    if (ctx->texm3x2pad_src0 == -1)
        return;

    char dst[64];
    char src0[64];
    char src1[64];
    char src2[64];

    // !!! FIXME: this code counts on the register not having swizzles, etc.
    const int stage = ctx->dest_arg.regnum;
    get_ARB1_varname_in_buf(ctx, REG_TYPE_TEXTURE, ctx->texm3x2pad_src0,
                            src0, sizeof (src0));
    get_ARB1_varname_in_buf(ctx, REG_TYPE_TEXTURE, ctx->texm3x2pad_dst0,
                            src1, sizeof (src1));
    get_ARB1_varname_in_buf(ctx, REG_TYPE_TEXTURE, ctx->source_args[0].regnum,
                            src2, sizeof (src2));
    get_ARB1_destarg_varname(ctx, dst, sizeof (dst));

    output_line(ctx, "DP3 %s.y, %s, %s;", dst, src2, dst);
    output_line(ctx, "DP3 %s.x, %s, %s;", dst, src0, src1);
    output_line(ctx, "TEX %s, %s, texture[%d], 2D;", dst, dst, stage);
    emit_ARB1_dest_modifiers(ctx);
}